

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O2

void __thiscall
sqvector<SQClassMember>::resize
          (sqvector<SQClassMember> *this,SQUnsignedInteger newsize,SQClassMember *fill)

{
  ulong uVar1;
  SQUnsignedInteger SVar2;
  long lVar3;
  
  if (this->_allocated < newsize) {
    _realloc(this,newsize);
  }
  uVar1 = this->_size;
  if (uVar1 < newsize) {
    while (uVar1 < newsize) {
      SQClassMember::SQClassMember(this->_vals + uVar1,fill);
      uVar1 = this->_size + 1;
      this->_size = uVar1;
    }
  }
  else {
    lVar3 = newsize << 5;
    for (SVar2 = newsize; SVar2 < uVar1; SVar2 = SVar2 + 1) {
      SQClassMember::~SQClassMember
                ((SQClassMember *)((long)&(this->_vals->val).super_SQObject._type + lVar3));
      uVar1 = this->_size;
      lVar3 = lVar3 + 0x20;
    }
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }